

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  int iVar32;
  undefined4 uVar33;
  uint uVar34;
  byte bVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ulong *puVar40;
  ulong *puVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong unaff_R12;
  size_t mask;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  bool bVar55;
  bool bVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar72;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  __m128 a;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  uint uVar97;
  uint uVar98;
  uint uVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [564];
  RTCFilterFunctionNArguments local_16b0;
  undefined8 local_1680;
  uint uStack_1678;
  uint uStack_1674;
  uint uStack_1670;
  uint uStack_166c;
  uint uStack_1668;
  uint uStack_1664;
  uint local_1660;
  uint uStack_165c;
  uint uStack_1658;
  uint uStack_1654;
  uint uStack_1650;
  uint uStack_164c;
  uint uStack_1648;
  uint uStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_1480 [32];
  float local_1460 [4];
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440 [4];
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420 [4];
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined4 uStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [8];
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  undefined1 local_1360 [32];
  undefined4 local_1340;
  undefined4 uStack_133c;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  RTCHitN local_1320 [32];
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar118 = ZEXT3264(CONCAT428(fVar85,CONCAT424(fVar85,CONCAT420(fVar85,CONCAT416(fVar85,CONCAT412(
                                                  fVar85,CONCAT48(fVar85,CONCAT44(fVar85,fVar85)))))
                                                )));
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1540._4_4_ = fVar72;
  local_1540._0_4_ = fVar72;
  local_1540._8_4_ = fVar72;
  local_1540._12_4_ = fVar72;
  local_1540._16_4_ = fVar72;
  local_1540._20_4_ = fVar72;
  local_1540._24_4_ = fVar72;
  local_1540._28_4_ = fVar72;
  auVar95 = ZEXT3264(local_1540);
  fVar100 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1560._4_4_ = fVar100;
  local_1560._0_4_ = fVar100;
  local_1560._8_4_ = fVar100;
  local_1560._12_4_ = fVar100;
  local_1560._16_4_ = fVar100;
  local_1560._20_4_ = fVar100;
  local_1560._24_4_ = fVar100;
  local_1560._28_4_ = fVar100;
  auVar96 = ZEXT3264(local_1560);
  fVar85 = fVar85 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar72 = fVar72 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar100 = fVar100 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1580._0_8_ = CONCAT44(fVar85,fVar85) ^ 0x8000000080000000;
  local_1580._8_4_ = -fVar85;
  local_1580._12_4_ = -fVar85;
  local_1580._16_4_ = -fVar85;
  local_1580._20_4_ = -fVar85;
  local_1580._24_4_ = -fVar85;
  local_1580._28_4_ = -fVar85;
  auVar105 = ZEXT3264(local_1580);
  local_15a0._0_8_ = CONCAT44(fVar72,fVar72) ^ 0x8000000080000000;
  local_15a0._8_4_ = -fVar72;
  local_15a0._12_4_ = -fVar72;
  local_15a0._16_4_ = -fVar72;
  local_15a0._20_4_ = -fVar72;
  local_15a0._24_4_ = -fVar72;
  local_15a0._28_4_ = -fVar72;
  auVar108 = ZEXT3264(local_15a0);
  iVar32 = (tray->tnear).field_0.i[k];
  local_15c0._4_4_ = iVar32;
  local_15c0._0_4_ = iVar32;
  local_15c0._8_4_ = iVar32;
  local_15c0._12_4_ = iVar32;
  local_15c0._16_4_ = iVar32;
  local_15c0._20_4_ = iVar32;
  local_15c0._24_4_ = iVar32;
  local_15c0._28_4_ = iVar32;
  auVar111 = ZEXT3264(local_15c0);
  local_1340 = 0x80000000;
  uStack_133c = 0x80000000;
  uStack_1338 = 0x80000000;
  uStack_1334 = 0x80000000;
  uStack_1330 = 0x80000000;
  uStack_132c = 0x80000000;
  uStack_1328 = 0x80000000;
  uStack_1324 = 0x80000000;
  local_15e0._0_8_ = CONCAT44(fVar100,fVar100) ^ 0x8000000080000000;
  local_15e0._8_4_ = -fVar100;
  local_15e0._12_4_ = -fVar100;
  local_15e0._16_4_ = -fVar100;
  local_15e0._20_4_ = -fVar100;
  local_15e0._24_4_ = -fVar100;
  local_15e0._28_4_ = -fVar100;
  auVar114 = ZEXT3264(local_15e0);
  iVar32 = (tray->tfar).field_0.i[k];
  local_1600._4_4_ = iVar32;
  local_1600._0_4_ = iVar32;
  local_1600._8_4_ = iVar32;
  local_1600._12_4_ = iVar32;
  local_1600._16_4_ = iVar32;
  local_1600._20_4_ = iVar32;
  local_1600._24_4_ = iVar32;
  local_1600._28_4_ = iVar32;
  auVar117 = ZEXT3264(local_1600);
  local_1360._16_16_ = mm_lookupmask_ps._240_16_;
  local_1360._0_16_ = mm_lookupmask_ps._0_16_;
  iVar32 = 1 << ((uint)k & 0x1f);
  auVar89._4_4_ = iVar32;
  auVar89._0_4_ = iVar32;
  auVar89._8_4_ = iVar32;
  auVar89._12_4_ = iVar32;
  auVar89._16_4_ = iVar32;
  auVar89._20_4_ = iVar32;
  auVar89._24_4_ = iVar32;
  auVar89._28_4_ = iVar32;
  auVar57 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar89 = vpand_avx2(auVar89,auVar57);
  local_13a0 = vpcmpeqd_avx2(auVar89,auVar57);
  auVar57._8_4_ = 0xbf800000;
  auVar57._0_8_ = 0xbf800000bf800000;
  auVar57._12_4_ = 0xbf800000;
  auVar57._16_4_ = 0xbf800000;
  auVar57._20_4_ = 0xbf800000;
  auVar57._24_4_ = 0xbf800000;
  auVar57._28_4_ = 0xbf800000;
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = &DAT_3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  _local_1380 = vblendvps_avx(auVar62,auVar57,local_1360);
  puVar41 = local_11f8;
  do {
    puVar40 = puVar41;
    if (puVar40 == &local_1200) break;
    puVar41 = puVar40 + -1;
    uVar50 = puVar40[-1];
    do {
      if ((uVar50 & 8) == 0) {
        auVar15 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar44),auVar105._0_32_,
                                  auVar118._0_32_);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar46),auVar108._0_32_,
                                  auVar95._0_32_);
        auVar89 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
        auVar15 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + uVar47),auVar114._0_32_,
                                  auVar96._0_32_);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar44 ^ 0x20)),
                                  auVar105._0_32_,auVar118._0_32_);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar46 ^ 0x20)),
                                  auVar108._0_32_,auVar95._0_32_);
        auVar62 = vpminsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar17));
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar50 + 0x40 + (uVar47 ^ 0x20)),
                                  auVar114._0_32_,auVar96._0_32_);
        auVar57 = vpmaxsd_avx2(ZEXT1632(auVar15),auVar111._0_32_);
        auVar89 = vpmaxsd_avx2(auVar89,auVar57);
        auVar57 = vpminsd_avx2(ZEXT1632(auVar16),auVar117._0_32_);
        auVar57 = vpminsd_avx2(auVar62,auVar57);
        auVar89 = vpcmpgtd_avx2(auVar89,auVar57);
        uVar33 = vmovmskps_avx(auVar89);
        unaff_R12 = (ulong)(byte)~(byte)uVar33;
      }
      if ((uVar50 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar34 = 4;
        }
        else {
          uVar49 = uVar50 & 0xfffffffffffffff0;
          lVar39 = 0;
          for (uVar50 = unaff_R12; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar34 = 0;
          for (uVar36 = unaff_R12 - 1 & unaff_R12; uVar50 = *(ulong *)(uVar49 + lVar39 * 8),
              uVar36 != 0; uVar36 = uVar36 - 1 & uVar36) {
            *puVar41 = uVar50;
            puVar41 = puVar41 + 1;
            lVar39 = 0;
            for (uVar50 = uVar36; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
          }
        }
      }
      else {
        uVar34 = 6;
      }
    } while (uVar34 == 0);
    if (uVar34 == 6) {
      uVar49 = (ulong)((uint)uVar50 & 0xf);
      uVar36 = uVar49 - 8;
      bVar55 = uVar49 != 8;
      if (bVar55) {
        uVar50 = uVar50 & 0xfffffffffffffff0;
        uVar49 = 0;
        do {
          lVar37 = uVar49 * 0x90;
          lVar39 = lVar37 + uVar50;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = *(ulong *)(uVar50 + 0x40 + lVar37);
          auVar17 = vpmovzxbw_avx(auVar15);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(uVar50 + 0x48 + lVar37);
          auVar15 = vpmovzxbw_avx(auVar16);
          auVar15 = vpminuw_avx(auVar17,auVar15);
          auVar15 = vpcmpeqw_avx(auVar17,auVar15);
          auVar15 = vpacksswb_avx(auVar15,auVar15);
          uVar33 = *(undefined4 *)(uVar50 + 0x70 + lVar37);
          auVar63._4_4_ = uVar33;
          auVar63._0_4_ = uVar33;
          auVar63._8_4_ = uVar33;
          auVar63._12_4_ = uVar33;
          auVar63._16_4_ = uVar33;
          auVar63._20_4_ = uVar33;
          auVar63._24_4_ = uVar33;
          auVar63._28_4_ = uVar33;
          uVar33 = *(undefined4 *)(uVar50 + 0x7c + lVar37);
          auVar73._4_4_ = uVar33;
          auVar73._0_4_ = uVar33;
          auVar73._8_4_ = uVar33;
          auVar73._12_4_ = uVar33;
          auVar73._16_4_ = uVar33;
          auVar73._20_4_ = uVar33;
          auVar73._24_4_ = uVar33;
          auVar73._28_4_ = uVar33;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)((uVar44 >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar17);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar16 = vfmadd213ps_fma(auVar89,auVar73,auVar63);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(((uVar44 ^ 0x20) >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar2);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar17 = vfmadd213ps_fma(auVar89,auVar73,auVar63);
          uVar33 = *(undefined4 *)(uVar50 + 0x74 + lVar37);
          auVar64._4_4_ = uVar33;
          auVar64._0_4_ = uVar33;
          auVar64._8_4_ = uVar33;
          auVar64._12_4_ = uVar33;
          auVar64._16_4_ = uVar33;
          auVar64._20_4_ = uVar33;
          auVar64._24_4_ = uVar33;
          auVar64._28_4_ = uVar33;
          uVar33 = *(undefined4 *)(uVar50 + 0x80 + lVar37);
          auVar74._4_4_ = uVar33;
          auVar74._0_4_ = uVar33;
          auVar74._8_4_ = uVar33;
          auVar74._12_4_ = uVar33;
          auVar74._16_4_ = uVar33;
          auVar74._20_4_ = uVar33;
          auVar74._24_4_ = uVar33;
          auVar74._28_4_ = uVar33;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((uVar46 >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar3);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar2 = vfmadd213ps_fma(auVar89,auVar74,auVar64);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(((uVar46 ^ 0x20) >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar4);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar3 = vfmadd213ps_fma(auVar89,auVar74,auVar64);
          uVar33 = *(undefined4 *)(uVar50 + 0x78 + lVar37);
          auVar65._4_4_ = uVar33;
          auVar65._0_4_ = uVar33;
          auVar65._8_4_ = uVar33;
          auVar65._12_4_ = uVar33;
          auVar65._16_4_ = uVar33;
          auVar65._20_4_ = uVar33;
          auVar65._24_4_ = uVar33;
          auVar65._28_4_ = uVar33;
          uVar33 = *(undefined4 *)(uVar50 + 0x84 + lVar37);
          auVar75._4_4_ = uVar33;
          auVar75._0_4_ = uVar33;
          auVar75._8_4_ = uVar33;
          auVar75._12_4_ = uVar33;
          auVar75._16_4_ = uVar33;
          auVar75._20_4_ = uVar33;
          auVar75._24_4_ = uVar33;
          auVar75._28_4_ = uVar33;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((uVar47 >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar5);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar4 = vfmadd213ps_fma(auVar89,auVar75,auVar65);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(((uVar47 ^ 0x20) >> 2) + 0x40 + lVar39);
          auVar89 = vpmovzxbd_avx2(auVar6);
          auVar89 = vcvtdq2ps_avx(auVar89);
          auVar5 = vfmadd213ps_fma(auVar89,auVar75,auVar65);
          auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar118._0_32_,auVar105._0_32_);
          auVar2 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar95._0_32_,auVar108._0_32_);
          auVar89 = vpmaxsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar2));
          auVar16 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar96._0_32_,auVar114._0_32_);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar118._0_32_,auVar105._0_32_);
          auVar2 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar95._0_32_,auVar108._0_32_);
          auVar62 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar2));
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar96._0_32_,auVar114._0_32_);
          auVar57 = vpmaxsd_avx2(ZEXT1632(auVar16),auVar111._0_32_);
          auVar89 = vpmaxsd_avx2(auVar89,auVar57);
          auVar57 = vpminsd_avx2(ZEXT1632(auVar17),auVar117._0_32_);
          auVar57 = vpminsd_avx2(auVar62,auVar57);
          auVar89 = vpcmpgtd_avx2(auVar89,auVar57);
          uVar33 = vmovmskps_avx(auVar89);
          bVar35 = ~(byte)uVar33 &
                   (SUB161(auVar15 >> 7,0) & 1 | (SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar15 >> 0x17,0) & 1) << 2 | (SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar15 >> 0x27,0) & 1) << 4 | (SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar15 >> 0x37,0) & 1) << 6 | SUB161(auVar15 >> 0x3f,0) << 7);
          if (bVar35 != 0) {
            uVar54 = (ulong)bVar35;
            do {
              lVar37 = 0;
              for (uVar48 = uVar54; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                lVar37 = lVar37 + 1;
              }
              uVar7 = *(ushort *)(lVar39 + lVar37 * 8);
              uVar8 = *(ushort *)(lVar39 + 2 + lVar37 * 8);
              local_1660 = *(uint *)(lVar39 + 0x88);
              uStack_1678 = *(uint *)(lVar39 + 4 + lVar37 * 8);
              pGVar9 = (context->scene->geometries).items[local_1660].ptr;
              lVar37 = *(long *)&pGVar9->field_0x58;
              lVar42 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)uStack_1678;
              uVar43 = uVar7 & 0x7fff;
              uVar45 = uVar8 & 0x7fff;
              uVar34 = *(uint *)(lVar37 + 4 + lVar42);
              uVar53 = (ulong)uVar34;
              uVar38 = (ulong)(uVar34 * uVar45 + *(int *)(lVar37 + lVar42) + uVar43);
              p_Var10 = pGVar9[1].intersectionFilterN;
              lVar11 = *(long *)&pGVar9[1].time_range.upper;
              auVar15 = *(undefined1 (*) [16])(lVar11 + (uVar38 + 1) * (long)p_Var10);
              auVar16 = *(undefined1 (*) [16])(lVar11 + (uVar38 + uVar53) * (long)p_Var10);
              lVar52 = uVar38 + uVar53 + 1;
              auVar17 = *(undefined1 (*) [16])(lVar11 + lVar52 * (long)p_Var10);
              auVar2 = *(undefined1 (*) [16])
                        (lVar11 + (uVar38 + (-1 < (short)uVar7) + 1) * (long)p_Var10);
              lVar51 = (ulong)(-1 < (short)uVar7) + lVar52;
              auVar3 = *(undefined1 (*) [16])(lVar11 + lVar51 * (long)p_Var10);
              uVar48 = 0;
              if (-1 < (short)uVar8) {
                uVar48 = uVar53;
              }
              auVar4 = *(undefined1 (*) [16])(lVar11 + (uVar38 + uVar53 + uVar48) * (long)p_Var10);
              auVar5 = *(undefined1 (*) [16])(lVar11 + (lVar52 + uVar48) * (long)p_Var10);
              auVar93._16_16_ = *(undefined1 (*) [16])(lVar11 + (uVar48 + lVar51) * (long)p_Var10);
              auVar93._0_16_ = auVar17;
              auVar86 = vunpcklps_avx(auVar15,auVar3);
              auVar6 = vunpckhps_avx(auVar15,auVar3);
              auVar90 = vunpcklps_avx(auVar2,auVar17);
              auVar2 = vunpckhps_avx(auVar2,auVar17);
              auVar12 = vunpcklps_avx(auVar6,auVar2);
              auVar13 = vunpcklps_avx(auVar86,auVar90);
              auVar2 = vunpckhps_avx(auVar86,auVar90);
              auVar86 = vunpcklps_avx(auVar16,auVar5);
              auVar6 = vunpckhps_avx(auVar16,auVar5);
              auVar90 = vunpcklps_avx(auVar17,auVar4);
              auVar4 = vunpckhps_avx(auVar17,auVar4);
              auVar6 = vunpcklps_avx(auVar6,auVar4);
              auVar14 = vunpcklps_avx(auVar86,auVar90);
              auVar4 = vunpckhps_avx(auVar86,auVar90);
              auVar76._16_16_ = auVar5;
              auVar76._0_16_ = auVar16;
              auVar66._16_16_ = auVar3;
              auVar66._0_16_ = auVar15;
              auVar89 = vunpcklps_avx(auVar66,auVar76);
              auVar58._16_16_ = auVar17;
              auVar58._0_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var10 * uVar38);
              auVar57 = vunpcklps_avx(auVar58,auVar93);
              auVar73 = vunpcklps_avx(auVar57,auVar89);
              auVar74 = vunpckhps_avx(auVar57,auVar89);
              auVar89 = vunpckhps_avx(auVar66,auVar76);
              auVar57 = vunpckhps_avx(auVar58,auVar93);
              auVar75 = vunpcklps_avx(auVar57,auVar89);
              auVar59._16_16_ = auVar13;
              auVar59._0_16_ = auVar13;
              auVar77._16_16_ = auVar2;
              auVar77._0_16_ = auVar2;
              auVar87._16_16_ = auVar12;
              auVar87._0_16_ = auVar12;
              auVar91._16_16_ = auVar14;
              auVar91._0_16_ = auVar14;
              auVar103._16_16_ = auVar4;
              auVar103._0_16_ = auVar4;
              auVar106._16_16_ = auVar6;
              auVar106._0_16_ = auVar6;
              auVar57 = vsubps_avx(auVar73,auVar59);
              auVar89 = vsubps_avx(auVar74,auVar77);
              auVar62 = vsubps_avx(auVar75,auVar87);
              auVar63 = vsubps_avx(auVar91,auVar73);
              auVar64 = vsubps_avx(auVar103,auVar74);
              auVar65 = vsubps_avx(auVar106,auVar75);
              auVar18._4_4_ = auVar89._4_4_ * auVar65._4_4_;
              auVar18._0_4_ = auVar89._0_4_ * auVar65._0_4_;
              auVar18._8_4_ = auVar89._8_4_ * auVar65._8_4_;
              auVar18._12_4_ = auVar89._12_4_ * auVar65._12_4_;
              auVar18._16_4_ = auVar89._16_4_ * auVar65._16_4_;
              auVar18._20_4_ = auVar89._20_4_ * auVar65._20_4_;
              auVar18._24_4_ = auVar89._24_4_ * auVar65._24_4_;
              auVar18._28_4_ = auVar13._12_4_;
              auVar3 = vfmsub231ps_fma(auVar18,auVar64,auVar62);
              uVar33 = *(undefined4 *)(ray + k * 4);
              auVar109._4_4_ = uVar33;
              auVar109._0_4_ = uVar33;
              auVar109._8_4_ = uVar33;
              auVar109._12_4_ = uVar33;
              auVar109._16_4_ = uVar33;
              auVar109._20_4_ = uVar33;
              auVar109._24_4_ = uVar33;
              auVar109._28_4_ = uVar33;
              uVar33 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar112._4_4_ = uVar33;
              auVar112._0_4_ = uVar33;
              auVar112._8_4_ = uVar33;
              auVar112._12_4_ = uVar33;
              auVar112._16_4_ = uVar33;
              auVar112._20_4_ = uVar33;
              auVar112._24_4_ = uVar33;
              auVar112._28_4_ = uVar33;
              uVar33 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar115._4_4_ = uVar33;
              auVar115._0_4_ = uVar33;
              auVar115._8_4_ = uVar33;
              auVar115._12_4_ = uVar33;
              auVar115._16_4_ = uVar33;
              auVar115._20_4_ = uVar33;
              auVar115._24_4_ = uVar33;
              auVar115._28_4_ = uVar33;
              fVar85 = *(float *)(ray + k * 4 + 0x80);
              auVar104._4_4_ = fVar85;
              auVar104._0_4_ = fVar85;
              auVar104._8_4_ = fVar85;
              auVar104._12_4_ = fVar85;
              auVar104._16_4_ = fVar85;
              auVar104._20_4_ = fVar85;
              auVar104._24_4_ = fVar85;
              auVar104._28_4_ = fVar85;
              auVar19._4_4_ = auVar62._4_4_ * auVar63._4_4_;
              auVar19._0_4_ = auVar62._0_4_ * auVar63._0_4_;
              auVar19._8_4_ = auVar62._8_4_ * auVar63._8_4_;
              auVar19._12_4_ = auVar62._12_4_ * auVar63._12_4_;
              auVar19._16_4_ = auVar62._16_4_ * auVar63._16_4_;
              auVar19._20_4_ = auVar62._20_4_ * auVar63._20_4_;
              auVar19._24_4_ = auVar62._24_4_ * auVar63._24_4_;
              auVar19._28_4_ = auVar2._12_4_;
              auVar73 = vsubps_avx(auVar73,auVar109);
              fVar72 = *(float *)(ray + k * 4 + 0xa0);
              auVar110._4_4_ = fVar72;
              auVar110._0_4_ = fVar72;
              auVar110._8_4_ = fVar72;
              auVar110._12_4_ = fVar72;
              auVar110._16_4_ = fVar72;
              auVar110._20_4_ = fVar72;
              auVar110._24_4_ = fVar72;
              auVar110._28_4_ = fVar72;
              auVar2 = vfmsub231ps_fma(auVar19,auVar65,auVar57);
              auVar74 = vsubps_avx(auVar74,auVar112);
              fVar100 = *(float *)(ray + k * 4 + 0xc0);
              auVar113._4_4_ = fVar100;
              auVar113._0_4_ = fVar100;
              auVar113._8_4_ = fVar100;
              auVar113._12_4_ = fVar100;
              auVar113._16_4_ = fVar100;
              auVar113._20_4_ = fVar100;
              auVar113._24_4_ = fVar100;
              auVar113._28_4_ = fVar100;
              auVar75 = vsubps_avx(auVar75,auVar115);
              auVar20._4_4_ = fVar85 * auVar74._4_4_;
              auVar20._0_4_ = fVar85 * auVar74._0_4_;
              auVar20._8_4_ = fVar85 * auVar74._8_4_;
              auVar20._12_4_ = fVar85 * auVar74._12_4_;
              auVar20._16_4_ = fVar85 * auVar74._16_4_;
              auVar20._20_4_ = fVar85 * auVar74._20_4_;
              auVar20._24_4_ = fVar85 * auVar74._24_4_;
              auVar20._28_4_ = uVar33;
              auVar15 = vfmsub231ps_fma(auVar20,auVar73,auVar110);
              auVar21._4_4_ = auVar65._4_4_ * auVar15._4_4_;
              auVar21._0_4_ = auVar65._0_4_ * auVar15._0_4_;
              auVar21._8_4_ = auVar65._8_4_ * auVar15._8_4_;
              auVar21._12_4_ = auVar65._12_4_ * auVar15._12_4_;
              auVar21._16_4_ = auVar65._16_4_ * 0.0;
              auVar21._20_4_ = auVar65._20_4_ * 0.0;
              auVar21._24_4_ = auVar65._24_4_ * 0.0;
              auVar21._28_4_ = auVar65._28_4_;
              auVar116._0_4_ = auVar62._0_4_ * auVar15._0_4_;
              auVar116._4_4_ = auVar62._4_4_ * auVar15._4_4_;
              auVar116._8_4_ = auVar62._8_4_ * auVar15._8_4_;
              auVar116._12_4_ = auVar62._12_4_ * auVar15._12_4_;
              auVar116._16_4_ = auVar62._16_4_ * 0.0;
              auVar116._20_4_ = auVar62._20_4_ * 0.0;
              auVar116._24_4_ = auVar62._24_4_ * 0.0;
              auVar116._28_4_ = 0;
              auVar22._4_4_ = fVar100 * auVar73._4_4_;
              auVar22._0_4_ = fVar100 * auVar73._0_4_;
              auVar22._8_4_ = fVar100 * auVar73._8_4_;
              auVar22._12_4_ = fVar100 * auVar73._12_4_;
              auVar22._16_4_ = fVar100 * auVar73._16_4_;
              auVar22._20_4_ = fVar100 * auVar73._20_4_;
              auVar22._24_4_ = fVar100 * auVar73._24_4_;
              auVar22._28_4_ = auVar62._28_4_;
              auVar16 = vfmsub231ps_fma(auVar22,auVar75,auVar104);
              auVar15 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar16),auVar64);
              auVar16 = vfmadd231ps_fma(auVar116,auVar89,ZEXT1632(auVar16));
              auVar23._4_4_ = auVar57._4_4_ * auVar64._4_4_;
              auVar23._0_4_ = auVar57._0_4_ * auVar64._0_4_;
              auVar23._8_4_ = auVar57._8_4_ * auVar64._8_4_;
              auVar23._12_4_ = auVar57._12_4_ * auVar64._12_4_;
              auVar23._16_4_ = auVar57._16_4_ * auVar64._16_4_;
              auVar23._20_4_ = auVar57._20_4_ * auVar64._20_4_;
              auVar23._24_4_ = auVar57._24_4_ * auVar64._24_4_;
              auVar23._28_4_ = auVar64._28_4_;
              auVar17 = vfmsub231ps_fma(auVar23,auVar63,auVar89);
              auVar24._4_4_ = fVar72 * auVar75._4_4_;
              auVar24._0_4_ = fVar72 * auVar75._0_4_;
              auVar24._8_4_ = fVar72 * auVar75._8_4_;
              auVar24._12_4_ = fVar72 * auVar75._12_4_;
              auVar24._16_4_ = fVar72 * auVar75._16_4_;
              auVar24._20_4_ = fVar72 * auVar75._20_4_;
              auVar24._24_4_ = fVar72 * auVar75._24_4_;
              auVar24._28_4_ = auVar89._28_4_;
              auVar4 = vfmsub231ps_fma(auVar24,auVar74,auVar113);
              fVar85 = auVar17._0_4_;
              fVar72 = auVar17._4_4_;
              auVar25._4_4_ = fVar100 * fVar72;
              auVar25._0_4_ = fVar100 * fVar85;
              fVar80 = auVar17._8_4_;
              auVar25._8_4_ = fVar100 * fVar80;
              fVar81 = auVar17._12_4_;
              auVar25._12_4_ = fVar100 * fVar81;
              auVar25._16_4_ = fVar100 * 0.0;
              auVar25._20_4_ = fVar100 * 0.0;
              auVar25._24_4_ = fVar100 * 0.0;
              auVar25._28_4_ = fVar100;
              auVar17 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar2),auVar110);
              auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar3),auVar104);
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar4),auVar63);
              auVar31._4_4_ = uStack_133c;
              auVar31._0_4_ = local_1340;
              auVar31._8_4_ = uStack_1338;
              auVar31._12_4_ = uStack_1334;
              auVar31._16_4_ = uStack_1330;
              auVar31._20_4_ = uStack_132c;
              auVar31._24_4_ = uStack_1328;
              auVar31._28_4_ = uStack_1324;
              auVar89 = vandps_avx(ZEXT1632(auVar17),auVar31);
              uVar34 = auVar89._0_4_;
              auVar92._0_4_ = (float)(uVar34 ^ auVar15._0_4_);
              uVar97 = auVar89._4_4_;
              auVar92._4_4_ = (float)(uVar97 ^ auVar15._4_4_);
              uVar98 = auVar89._8_4_;
              auVar92._8_4_ = (float)(uVar98 ^ auVar15._8_4_);
              uVar99 = auVar89._12_4_;
              auVar92._12_4_ = (float)(uVar99 ^ auVar15._12_4_);
              fVar100 = auVar89._16_4_;
              auVar92._16_4_ = fVar100;
              fVar101 = auVar89._20_4_;
              auVar92._20_4_ = fVar101;
              fVar102 = auVar89._24_4_;
              auVar92._24_4_ = fVar102;
              fVar82 = auVar89._28_4_;
              auVar92._28_4_ = fVar82;
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar57,ZEXT1632(auVar4));
              auVar94._0_4_ = (float)(uVar34 ^ auVar15._0_4_);
              auVar94._4_4_ = (float)(uVar97 ^ auVar15._4_4_);
              auVar94._8_4_ = (float)(uVar98 ^ auVar15._8_4_);
              auVar94._12_4_ = (float)(uVar99 ^ auVar15._12_4_);
              auVar94._16_4_ = fVar100;
              auVar94._20_4_ = fVar101;
              auVar94._24_4_ = fVar102;
              auVar94._28_4_ = fVar82;
              auVar89 = vcmpps_avx(auVar92,ZEXT832(0) << 0x20,5);
              auVar57 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
              auVar89 = vandps_avx(auVar57,auVar89);
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar67._16_4_ = 0x7fffffff;
              auVar67._20_4_ = 0x7fffffff;
              auVar67._24_4_ = 0x7fffffff;
              auVar67._28_4_ = 0x7fffffff;
              local_14c0 = vandps_avx(ZEXT1632(auVar17),auVar67);
              auVar57 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,4);
              auVar89 = vandps_avx(auVar89,auVar57);
              auVar107._0_4_ = auVar94._0_4_ + auVar92._0_4_;
              auVar107._4_4_ = auVar94._4_4_ + auVar92._4_4_;
              auVar107._8_4_ = auVar94._8_4_ + auVar92._8_4_;
              auVar107._12_4_ = auVar94._12_4_ + auVar92._12_4_;
              auVar107._16_4_ = fVar100 + fVar100;
              auVar107._20_4_ = fVar101 + fVar101;
              auVar107._24_4_ = fVar102 + fVar102;
              auVar107._28_4_ = fVar82 + fVar82;
              auVar57 = vcmpps_avx(auVar107,local_14c0,2);
              auVar62 = auVar57 & auVar89;
              if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar62 >> 0x7f,0) != '\0') ||
                    (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar62 >> 0xbf,0) != '\0') ||
                  (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar62[0x1f] < '\0') {
                auVar89 = vandps_avx(auVar89,auVar57);
                auVar15 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
                auVar26._4_4_ = fVar72 * auVar75._4_4_;
                auVar26._0_4_ = fVar85 * auVar75._0_4_;
                auVar26._8_4_ = fVar80 * auVar75._8_4_;
                auVar26._12_4_ = fVar81 * auVar75._12_4_;
                auVar26._16_4_ = auVar75._16_4_ * 0.0;
                auVar26._20_4_ = auVar75._20_4_ * 0.0;
                auVar26._24_4_ = auVar75._24_4_ * 0.0;
                auVar26._28_4_ = auVar75._28_4_;
                auVar16 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar2),auVar26);
                auVar16 = vfmadd213ps_fma(auVar73,ZEXT1632(auVar3),ZEXT1632(auVar16));
                local_14e0._0_4_ = (float)(uVar34 ^ auVar16._0_4_);
                local_14e0._4_4_ = (float)(uVar97 ^ auVar16._4_4_);
                local_14e0._8_4_ = (float)(uVar98 ^ auVar16._8_4_);
                local_14e0._12_4_ = (float)(uVar99 ^ auVar16._12_4_);
                local_14e0._16_4_ = fVar100;
                local_14e0._20_4_ = fVar101;
                local_14e0._24_4_ = fVar102;
                local_14e0._28_4_ = fVar82;
                fVar82 = *(float *)(ray + k * 4 + 0x60);
                fVar83 = local_14c0._0_4_;
                fVar84 = local_14c0._4_4_;
                auVar27._4_4_ = fVar84 * fVar82;
                auVar27._0_4_ = fVar83 * fVar82;
                fVar61 = local_14c0._8_4_;
                auVar27._8_4_ = fVar61 * fVar82;
                fVar68 = local_14c0._12_4_;
                auVar27._12_4_ = fVar68 * fVar82;
                fVar69 = local_14c0._16_4_;
                auVar27._16_4_ = fVar69 * fVar82;
                fVar70 = local_14c0._20_4_;
                auVar27._20_4_ = fVar70 * fVar82;
                fVar71 = local_14c0._24_4_;
                auVar27._24_4_ = fVar71 * fVar82;
                auVar27._28_4_ = fVar82;
                auVar89 = vcmpps_avx(auVar27,local_14e0,1);
                fVar82 = *(float *)(ray + k * 4 + 0x100);
                auVar28._4_4_ = fVar84 * fVar82;
                auVar28._0_4_ = fVar83 * fVar82;
                auVar28._8_4_ = fVar61 * fVar82;
                auVar28._12_4_ = fVar68 * fVar82;
                auVar28._16_4_ = fVar69 * fVar82;
                auVar28._20_4_ = fVar70 * fVar82;
                auVar28._24_4_ = fVar71 * fVar82;
                auVar28._28_4_ = fVar82;
                auVar57 = vcmpps_avx(local_14e0,auVar28,2);
                auVar89 = vandps_avx(auVar89,auVar57);
                auVar16 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
                auVar15 = vpand_avx(auVar15,auVar16);
                auVar89 = vpmovzxwd_avx2(auVar15);
                auVar89 = vpslld_avx2(auVar89,0x1f);
                if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar89 >> 0x7f,0) != '\0') ||
                      (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar89 >> 0xbf,0) != '\0') ||
                    (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar89[0x1f] < '\0') {
                  local_1480 = vpsrad_avx2(auVar89,0x1f);
                  auVar89 = vsubps_avx(local_14c0,auVar94);
                  auVar89 = vblendvps_avx(auVar92,auVar89,local_1360);
                  auVar57 = vsubps_avx(local_14c0,auVar92);
                  auVar57 = vblendvps_avx(auVar94,auVar57,local_1360);
                  local_1400._0_4_ = (float)local_1380._0_4_ * auVar3._0_4_;
                  local_1400._4_4_ = (float)local_1380._4_4_ * auVar3._4_4_;
                  local_1400._8_4_ = fStack_1378 * auVar3._8_4_;
                  local_1400._12_4_ = fStack_1374 * auVar3._12_4_;
                  local_1400._16_4_ = fStack_1370 * 0.0;
                  local_1400._20_4_ = fStack_136c * 0.0;
                  local_1400._24_4_ = fStack_1368 * 0.0;
                  local_1400._28_4_ = 0;
                  local_13e0._4_4_ = (float)local_1380._4_4_ * auVar2._4_4_;
                  local_13e0._0_4_ = (float)local_1380._0_4_ * auVar2._0_4_;
                  local_13e0._8_4_ = fStack_1378 * auVar2._8_4_;
                  local_13e0._12_4_ = fStack_1374 * auVar2._12_4_;
                  local_13e0._16_4_ = fStack_1370 * 0.0;
                  local_13e0._20_4_ = fStack_136c * 0.0;
                  local_13e0._24_4_ = fStack_1368 * 0.0;
                  local_13e0._28_4_ = 0;
                  local_13c0._4_4_ = (float)local_1380._4_4_ * fVar72;
                  local_13c0._0_4_ = (float)local_1380._0_4_ * fVar85;
                  local_13c0._8_4_ = fStack_1378 * fVar80;
                  local_13c0._12_4_ = fStack_1374 * fVar81;
                  local_13c0._16_4_ = fStack_1370 * 0.0;
                  local_13c0._20_4_ = fStack_136c * 0.0;
                  local_13c0._24_4_ = fStack_1368 * 0.0;
                  local_13c0._28_4_ = 0;
                  auVar60._0_8_ = (ulong)CONCAT24(uVar7,(uint)uVar7) & 0x7fff00007fff;
                  auVar60._8_4_ = uVar43;
                  auVar60._12_4_ = uVar43;
                  auVar60._16_4_ = uVar43;
                  auVar60._20_4_ = uVar43;
                  auVar60._24_4_ = uVar43;
                  auVar60._28_4_ = uVar43;
                  auVar62 = vpaddd_avx2(auVar60,_DAT_0205d4c0);
                  auVar86._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + lVar42) - 1);
                  auVar86._4_12_ = auVar118._4_12_;
                  auVar78._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                  auVar78._8_4_ = uVar45;
                  auVar78._12_4_ = uVar45;
                  auVar78._16_4_ = uVar45;
                  auVar78._20_4_ = uVar45;
                  auVar78._24_4_ = uVar45;
                  auVar78._28_4_ = uVar45;
                  auVar63 = vpaddd_avx2(auVar78,_DAT_0205d4e0);
                  auVar15 = vrcpss_avx(auVar86,auVar86);
                  auVar90._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + lVar42) - 1);
                  auVar90._4_12_ = auVar118._4_12_;
                  auVar16 = vfnmadd213ss_fma(auVar86,auVar15,SUB6416(ZEXT464(0x40000000),0));
                  fStack_1508 = auVar15._0_4_ * auVar16._0_4_;
                  auVar15 = vrcpss_avx(auVar90,auVar90);
                  auVar16 = vfnmadd213ss_fma(auVar90,auVar15,SUB6416(ZEXT464(0x40000000),0));
                  fVar85 = auVar15._0_4_ * auVar16._0_4_;
                  auVar62 = vcvtdq2ps_avx(auVar62);
                  fStack_1504 = auVar62._28_4_ + auVar89._28_4_;
                  local_1520 = (fVar83 * auVar62._0_4_ + auVar89._0_4_) * fStack_1508;
                  fStack_151c = (fVar84 * auVar62._4_4_ + auVar89._4_4_) * fStack_1508;
                  fStack_1518 = (fVar61 * auVar62._8_4_ + auVar89._8_4_) * fStack_1508;
                  fStack_1514 = (fVar68 * auVar62._12_4_ + auVar89._12_4_) * fStack_1508;
                  fStack_1510 = (fVar69 * auVar62._16_4_ + auVar89._16_4_) * fStack_1508;
                  fStack_150c = (fVar70 * auVar62._20_4_ + auVar89._20_4_) * fStack_1508;
                  fStack_1508 = (fVar71 * auVar62._24_4_ + auVar89._24_4_) * fStack_1508;
                  auVar89 = vcvtdq2ps_avx(auVar63);
                  fVar72 = (fVar83 * auVar89._0_4_ + auVar57._0_4_) * fVar85;
                  fVar80 = (fVar84 * auVar89._4_4_ + auVar57._4_4_) * fVar85;
                  local_1500._4_4_ = fVar80;
                  local_1500._0_4_ = fVar72;
                  fVar81 = (fVar61 * auVar89._8_4_ + auVar57._8_4_) * fVar85;
                  local_1500._8_4_ = fVar81;
                  fVar82 = (fVar68 * auVar89._12_4_ + auVar57._12_4_) * fVar85;
                  local_1500._12_4_ = fVar82;
                  fVar83 = (fVar69 * auVar89._16_4_ + auVar57._16_4_) * fVar85;
                  local_1500._16_4_ = fVar83;
                  fVar84 = (fVar70 * auVar89._20_4_ + auVar57._20_4_) * fVar85;
                  local_1500._20_4_ = fVar84;
                  fVar85 = (fVar71 * auVar89._24_4_ + auVar57._24_4_) * fVar85;
                  local_1500._24_4_ = fVar85;
                  local_1500._28_4_ = auVar89._28_4_ + auVar57._28_4_;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006e88ca:
                      auVar95 = ZEXT3264(local_1540);
                      auVar96 = ZEXT3264(local_1560);
                      auVar105 = ZEXT3264(local_1580);
                      auVar108 = ZEXT3264(local_15a0);
                      auVar111 = ZEXT3264(local_15c0);
                      auVar114 = ZEXT3264(local_15e0);
                      auVar117 = ZEXT3264(local_1600);
                      goto LAB_006e886c;
                    }
                    auVar89 = vrcpps_avx(local_14c0);
                    auVar88._8_4_ = 0x3f800000;
                    auVar88._0_8_ = &DAT_3f8000003f800000;
                    auVar88._12_4_ = 0x3f800000;
                    auVar88._16_4_ = 0x3f800000;
                    auVar88._20_4_ = 0x3f800000;
                    auVar88._24_4_ = 0x3f800000;
                    auVar88._28_4_ = 0x3f800000;
                    auVar15 = vfnmadd213ps_fma(local_14c0,auVar89,auVar88);
                    auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar89,auVar89);
                    fVar61 = auVar15._0_4_;
                    fVar68 = auVar15._4_4_;
                    fVar69 = auVar15._8_4_;
                    fVar70 = auVar15._12_4_;
                    local_1420[0] = fVar61 * local_14e0._0_4_;
                    local_1420[1] = fVar68 * local_14e0._4_4_;
                    local_1420[2] = fVar69 * local_14e0._8_4_;
                    local_1420[3] = fVar70 * local_14e0._12_4_;
                    fStack_1410 = fVar100 * 0.0;
                    fStack_140c = fVar101 * 0.0;
                    fStack_1408 = fVar102 * 0.0;
                    uStack_1404 = auVar89._28_4_;
                    local_1460[0] = local_1520 * fVar61;
                    local_1460[1] = fStack_151c * fVar68;
                    local_1460[2] = fStack_1518 * fVar69;
                    local_1460[3] = fStack_1514 * fVar70;
                    fStack_1450 = fStack_1510 * 0.0;
                    fStack_144c = fStack_150c * 0.0;
                    fStack_1448 = fStack_1508 * 0.0;
                    fStack_1444 = fStack_1504;
                    local_1440[0] = fVar72 * fVar61;
                    local_1440[1] = fVar80 * fVar68;
                    local_1440[2] = fVar81 * fVar69;
                    local_1440[3] = fVar82 * fVar70;
                    fStack_1430 = fVar83 * 0.0;
                    fStack_142c = fVar84 * 0.0;
                    fStack_1428 = fVar85 * 0.0;
                    fStack_1424 = fStack_1504;
                    uVar34 = vmovmskps_avx(local_1480);
                    bVar56 = uVar34 == 0;
                    if (!bVar56) {
                      uVar48 = 0;
                      uVar53 = (ulong)(uVar34 & 0xff);
                      for (uVar38 = uVar53; (uVar38 & 1) == 0;
                          uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                        uVar48 = uVar48 + 1;
                      }
                      local_1680 = CONCAT44(uStack_1678,uStack_1678);
                      local_1620 = auVar118._0_32_;
                      uStack_1674 = uStack_1678;
                      uStack_1670 = uStack_1678;
                      uStack_166c = uStack_1678;
                      uStack_1668 = uStack_1678;
                      uStack_1664 = uStack_1678;
                      uStack_165c = local_1660;
                      uStack_1658 = local_1660;
                      uStack_1654 = local_1660;
                      uStack_1650 = local_1660;
                      uStack_164c = local_1660;
                      uStack_1648 = local_1660;
                      uStack_1644 = local_1660;
                      do {
                        uVar33 = *(undefined4 *)(ray + k * 4 + 0x100);
                        local_12c0 = local_1460[uVar48];
                        local_12a0 = local_1440[uVar48];
                        *(float *)(ray + k * 4 + 0x100) = local_1420[uVar48];
                        uVar1 = *(undefined4 *)(local_1400 + uVar48 * 4);
                        local_1300 = *(undefined4 *)(local_13e0 + uVar48 * 4);
                        local_12e0 = *(undefined4 *)(local_13c0 + uVar48 * 4);
                        local_16b0.context = context->user;
                        local_1320[0] = (RTCHitN)(char)uVar1;
                        local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[4] = (RTCHitN)(char)uVar1;
                        local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[8] = (RTCHitN)(char)uVar1;
                        local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[0xc] = (RTCHitN)(char)uVar1;
                        local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[0x10] = (RTCHitN)(char)uVar1;
                        local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[0x14] = (RTCHitN)(char)uVar1;
                        local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[0x18] = (RTCHitN)(char)uVar1;
                        local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        local_1320[0x1c] = (RTCHitN)(char)uVar1;
                        local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                        local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                        local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                        uStack_12fc = local_1300;
                        uStack_12f8 = local_1300;
                        uStack_12f4 = local_1300;
                        uStack_12f0 = local_1300;
                        uStack_12ec = local_1300;
                        uStack_12e8 = local_1300;
                        uStack_12e4 = local_1300;
                        uStack_12dc = local_12e0;
                        uStack_12d8 = local_12e0;
                        uStack_12d4 = local_12e0;
                        uStack_12d0 = local_12e0;
                        uStack_12cc = local_12e0;
                        uStack_12c8 = local_12e0;
                        uStack_12c4 = local_12e0;
                        fStack_12bc = local_12c0;
                        fStack_12b8 = local_12c0;
                        fStack_12b4 = local_12c0;
                        fStack_12b0 = local_12c0;
                        fStack_12ac = local_12c0;
                        fStack_12a8 = local_12c0;
                        fStack_12a4 = local_12c0;
                        fStack_129c = local_12a0;
                        fStack_1298 = local_12a0;
                        fStack_1294 = local_12a0;
                        fStack_1290 = local_12a0;
                        fStack_128c = local_12a0;
                        fStack_1288 = local_12a0;
                        fStack_1284 = local_12a0;
                        local_1280 = local_1680;
                        uStack_1278 = CONCAT44(uStack_1674,uStack_1678);
                        uStack_1270 = CONCAT44(uStack_166c,uStack_1670);
                        uStack_1268 = CONCAT44(uStack_1664,uStack_1668);
                        local_1260._4_4_ = uStack_165c;
                        local_1260._0_4_ = local_1660;
                        local_1260._8_4_ = uStack_1658;
                        local_1260._12_4_ = uStack_1654;
                        local_1260._16_4_ = uStack_1650;
                        local_1260._20_4_ = uStack_164c;
                        local_1260._24_4_ = uStack_1648;
                        local_1260._28_4_ = uStack_1644;
                        vpcmpeqd_avx2(local_1260,local_1260);
                        uStack_123c = (local_16b0.context)->instID[0];
                        local_1240 = uStack_123c;
                        uStack_1238 = uStack_123c;
                        uStack_1234 = uStack_123c;
                        uStack_1230 = uStack_123c;
                        uStack_122c = uStack_123c;
                        uStack_1228 = uStack_123c;
                        uStack_1224 = uStack_123c;
                        uStack_121c = (local_16b0.context)->instPrimID[0];
                        local_1220 = uStack_121c;
                        uStack_1218 = uStack_121c;
                        uStack_1214 = uStack_121c;
                        uStack_1210 = uStack_121c;
                        uStack_120c = uStack_121c;
                        uStack_1208 = uStack_121c;
                        uStack_1204 = uStack_121c;
                        local_1640 = local_13a0._0_8_;
                        uStack_1638 = local_13a0._8_8_;
                        uStack_1630 = local_13a0._16_8_;
                        uStack_1628 = local_13a0._24_8_;
                        local_16b0.valid = (int *)&local_1640;
                        local_16b0.geometryUserPtr = pGVar9->userPtr;
                        local_16b0.hit = local_1320;
                        local_16b0.N = 8;
                        local_16b0.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_16b0);
                        }
                        auVar29._8_8_ = uStack_1638;
                        auVar29._0_8_ = local_1640;
                        auVar29._16_8_ = uStack_1630;
                        auVar29._24_8_ = uStack_1628;
                        auVar57 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                        auVar89 = _DAT_0205a980 & ~auVar57;
                        if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar89 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar89 >> 0x7f,0) == '\0') &&
                              (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar89 >> 0xbf,0) == '\0') &&
                            (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar89[0x1f]) {
                          auVar57 = auVar57 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var10)(&local_16b0);
                          }
                          auVar30._8_8_ = uStack_1638;
                          auVar30._0_8_ = local_1640;
                          auVar30._16_8_ = uStack_1630;
                          auVar30._24_8_ = uStack_1628;
                          auVar89 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30
                                                 );
                          auVar57 = auVar89 ^ _DAT_0205a980;
                          auVar79._8_4_ = 0xff800000;
                          auVar79._0_8_ = 0xff800000ff800000;
                          auVar79._12_4_ = 0xff800000;
                          auVar79._16_4_ = 0xff800000;
                          auVar79._20_4_ = 0xff800000;
                          auVar79._24_4_ = 0xff800000;
                          auVar79._28_4_ = 0xff800000;
                          auVar89 = vblendvps_avx(auVar79,*(undefined1 (*) [32])
                                                           (local_16b0.ray + 0x100),auVar89);
                          *(undefined1 (*) [32])(local_16b0.ray + 0x100) = auVar89;
                        }
                        if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar57 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar57 >> 0x7f,0) != '\0') ||
                              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar57 >> 0xbf,0) != '\0') ||
                            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar57[0x1f] < '\0') {
                          auVar118 = ZEXT3264(local_1620);
                          if (!bVar56) goto LAB_006e88ca;
                          break;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar33;
                        uVar38 = uVar48 & 0x3f;
                        uVar48 = 0;
                        uVar53 = uVar53 ^ 1L << uVar38;
                        for (uVar38 = uVar53; (uVar38 & 1) == 0;
                            uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                          uVar48 = uVar48 + 1;
                        }
                        bVar56 = uVar53 == 0;
                        auVar118 = ZEXT3264(local_1620);
                      } while (!bVar56);
                    }
                  }
                }
              }
              uVar54 = uVar54 - 1 & uVar54;
            } while (uVar54 != 0);
          }
          uVar49 = uVar49 + 1;
          bVar55 = uVar49 < uVar36;
          auVar95 = ZEXT3264(local_1540);
          auVar96 = ZEXT3264(local_1560);
          auVar105 = ZEXT3264(local_1580);
          auVar108 = ZEXT3264(local_15a0);
          auVar111 = ZEXT3264(local_15c0);
          auVar114 = ZEXT3264(local_15e0);
          auVar117 = ZEXT3264(local_1600);
        } while (uVar49 != uVar36);
      }
LAB_006e886c:
      uVar34 = 0;
      if (bVar55) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar34 = 1;
      }
    }
  } while ((uVar34 & 3) == 0);
  return puVar40 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }